

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuThreads.cpp
# Opt level: O0

void __thiscall xmrig::CpuThreads::CpuThreads(CpuThreads *this,Value *value)

{
  bool bVar1;
  uint uVar2;
  uint *affinity;
  Value *pVVar3;
  int64_t iVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RSI;
  undefined4 *in_RDI;
  size_t i;
  size_t threads;
  uint32_t intensity;
  CpuThread thread;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *v;
  ValueIterator __end2;
  ValueIterator __begin2;
  ConstArray *__range2;
  CpuThread *in_stack_ffffffffffffff28;
  CpuThreads *in_stack_ffffffffffffff30;
  Value *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  Value *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint64_t local_78;
  uint local_70;
  uint local_6c;
  ulong local_68;
  uint local_5c;
  CpuThread local_58;
  ValueIterator local_48;
  ValueIterator local_40;
  ValueIterator local_38;
  GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  local_30;
  GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  *local_28;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_10;
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 2) = 0xffffffffffffffff;
  local_10 = in_RSI;
  std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::vector
            ((vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *)0x2022c0);
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsArray(local_10);
  if (bVar1) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GetArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)in_stack_ffffffffffffff28);
    local_28 = &local_30;
    local_38 = rapidjson::
               GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
               ::begin((GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                        *)0x202314);
    local_40 = rapidjson::
               GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
               ::end((GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                      *)0x202335);
    for (; local_38 != local_40; local_38 = local_38 + 1) {
      local_48 = local_38;
      CpuThread::CpuThread
                ((CpuThread *)in_stack_ffffffffffffff30,(Value *)in_stack_ffffffffffffff28);
      bVar1 = CpuThread::isValid(&local_58);
      if (bVar1) {
        add(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
    }
    rapidjson::
    GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
    ::~GenericArray(&local_30);
  }
  else {
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsObject(local_10);
    if (bVar1) {
      local_5c = Json::getUint(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                               (uint)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      uVar2 = Json::getUint(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                            (uint)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      local_70 = 0x400;
      local_6c = uVar2;
      affinity = std::min<unsigned_int>(&local_6c,&local_70);
      local_68 = (ulong)*affinity;
      pVVar3 = Json::getValue(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
      iVar4 = getAffinityMask(in_stack_ffffffffffffff38);
      *(int64_t *)(in_RDI + 2) = iVar4;
      *in_RDI = 1;
      if ((local_5c == 0) || (5 < local_5c)) {
        local_5c = 1;
      }
      for (local_78 = 0; local_78 < local_68; local_78 = local_78 + 1) {
        getAffinity(local_78,*(int64_t *)(in_RDI + 2));
        add((CpuThreads *)CONCAT44(uVar2,in_stack_ffffffffffffff50),(int64_t)affinity,
            (uint32_t)((ulong)pVVar3 >> 0x20));
      }
    }
  }
  return;
}

Assistant:

xmrig::CpuThreads::CpuThreads(const rapidjson::Value &value)
{
    if (value.IsArray()) {
        for (auto &v : value.GetArray()) {
            CpuThread thread(v);
            if (thread.isValid()) {
                add(std::move(thread));
            }
        }
    }
    else if (value.IsObject()) {
        uint32_t intensity   = Json::getUint(value, kIntensity, 1);
        const size_t threads = std::min<unsigned>(Json::getUint(value, kThreads), 1024);
        m_affinity           = getAffinityMask(Json::getValue(value, kAffinity));
        m_format             = ObjectFormat;

        if (intensity < 1 || intensity > 5) {
            intensity = 1;
        }

        for (size_t i = 0; i < threads; ++i) {
            add(getAffinity(i, m_affinity), intensity);
        }
    }
}